

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePickerPrivate::setRange
          (DateTimePickerPrivate *this,QDateTime *min,QDateTime *max)

{
  QDateTime *this_00;
  bool bVar1;
  char cVar2;
  QDateTime *lhs;
  
  lhs = &this->minimum;
  bVar1 = operator!=(lhs,min);
  if (!bVar1) {
    bVar1 = operator!=(&this->maximum,max);
    if (!bVar1) {
      return;
    }
  }
  QDateTime::operator=(lhs,min);
  this_00 = &this->maximum;
  QDateTime::operator=(this_00,max);
  cVar2 = QDateTime::precedes(&this->value);
  if (cVar2 == '\0') {
    cVar2 = QDateTime::precedes(this_00);
    lhs = this_00;
    if (cVar2 == '\0') goto LAB_00169263;
  }
  QDateTime::operator=(&this->value,lhs);
LAB_00169263:
  fillValues(this,true);
  QWidget::updateGeometry();
  QWidget::update();
  return;
}

Assistant:

void
DateTimePickerPrivate::setRange( const QDateTime & min, const QDateTime & max )
{
	if( minimum != min || maximum != max )
	{
		minimum = min;
		maximum = max;

		if( value < minimum )
			value = minimum;
		else if( value > maximum )
			value = maximum;

		fillValues();

		q->updateGeometry();
		q->update();
	}
}